

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QPointF>::reserve(QList<QPointF> *this,qsizetype asize)

{
  bool bVar1;
  QArrayDataPointer<QPointF> *pQVar2;
  qsizetype qVar3;
  QPointF *b;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<QPointF> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QPointF> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<QPointF> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QPointF> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QPodArrayOps<QPointF> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<QPointF> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QArrayDataPointer<QPointF> *)capacity((QList<QPointF> *)0x717fbf);
  qVar3 = QArrayDataPointer<QPointF>::freeSpaceAtBegin(in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)pQVar2 - qVar3) {
    QArrayDataPointer<QPointF>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QPointF>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    if (bVar1) goto LAB_00718163;
    QArrayDataPointer<QPointF>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QPointF>::isShared(in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<QPointF>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<QPointF>::setFlag((QArrayDataPointer<QPointF> *)0x718067,(ArrayOptions)f.i);
      goto LAB_00718163;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QPointF *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QPointF> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<QPointF>::QArrayDataPointer
            (pQVar2,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  pQVar2 = (QArrayDataPointer<QPointF> *)QArrayDataPointer<QPointF>::operator->(&local_38);
  QArrayDataPointer<QPointF>::operator->(in_RDI);
  b = QArrayDataPointer<QPointF>::begin((QArrayDataPointer<QPointF> *)0x7180e7);
  QArrayDataPointer<QPointF>::operator->(in_RDI);
  QArrayDataPointer<QPointF>::end(pQVar2);
  QtPrivate::QPodArrayOps<QPointF>::copyAppend(in_stack_ffffffffffffff90,b,(QPointF *)pQVar2);
  pDVar4 = QArrayDataPointer<QPointF>::d_ptr(&local_38);
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<QPointF> *)QArrayDataPointer<QPointF>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)pQVar2,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QPointF>::setFlag
              ((QArrayDataPointer<QPointF> *)0x71814a,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<QPointF>::swap(pQVar2,in_stack_ffffffffffffff78);
  QArrayDataPointer<QPointF>::~QArrayDataPointer(pQVar2);
LAB_00718163:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}